

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDMMCAnalyzerResults.cpp
# Opt level: O3

void __thiscall
SDMMCAnalyzerResults::GenerateFrameTabularText
          (SDMMCAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  Frame frame;
  char str_arg [33];
  char str_cmd [33];
  Frame local_a0 [16];
  uint local_90;
  undefined4 uStack_8c;
  uint local_88;
  undefined4 uStack_84;
  char local_80;
  char local_78 [48];
  char local_48 [40];
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)local_a0);
  if (local_80 == '\x01') {
    AnalyzerHelpers::GetNumberString(CONCAT44(uStack_8c,local_90),Decimal,6,local_48,0x21);
    AnalyzerHelpers::GetNumberString(CONCAT44(uStack_84,local_88),display_base,0x20,local_78,0x21);
    SDMMCHelpers::MMCCommandDescription(local_90,local_88);
    AnalyzerResults::AddTabularText((char *)this,"CMD",local_48,", arg=",local_78," ");
  }
  Frame::~Frame(local_a0);
  return;
}

Assistant:

void SDMMCAnalyzerResults::GenerateFrameTabularText(U64 frame_index, DisplayBase display_base)
{
	ClearTabularText();
	Frame frame = GetFrame(frame_index);
	if (frame.mType != FRAMETYPE_COMMAND)
		return;
	char str_cmd[33];
	char str_arg[33];
	const char *str_desc;
	AnalyzerHelpers::GetNumberString(frame.mData1, Decimal, 6, str_cmd, sizeof(str_cmd));
	AnalyzerHelpers::GetNumberString(frame.mData2, display_base, 32, str_arg, sizeof(str_arg));
	str_desc = SDMMCHelpers::MMCCommandDescription(frame.mData1, frame.mData2);
	AddTabularText("CMD", str_cmd, ", arg=", str_arg, " ", str_desc);
}